

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void build_impute_node<InputData<double,int>&,WorkerMemory<ImputedData<int,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               InputData<double,_int> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<double,_std::allocator<double>_> *this;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  int iVar2;
  WeighImpRows WVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pIVar6;
  double *pdVar7;
  pointer pdVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  pointer pdVar13;
  unsigned_long *key;
  int *piVar14;
  uchar *puVar15;
  size_t col_1;
  ImputeNode *pIVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  pointer pvVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  size_t col_5;
  vector<double,_std::allocator<double>_> *__range3;
  long lVar24;
  size_t sVar25;
  size_t col;
  ulong uVar26;
  size_t sVar27;
  double dVar28;
  double extraout_XMM0_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar39;
  size_t ix;
  vector<double,_std::allocator<double>_> *__range3_1;
  double __tmp;
  double dStack_70;
  pointer local_68;
  double local_60;
  size_t local_58;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  ModelParams *local_48;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_40;
  double local_38;
  
  bVar10 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar11 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_58 = curr_depth;
  local_50 = imputer_tree;
  local_48 = model_params;
  if (bVar10 && bVar11) {
    lVar24 = (workspace->end - workspace->st) + 1;
    auVar29._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar29._0_8_ = lVar24;
    auVar29._12_4_ = 0x45300000;
    dStack_70 = auVar29._8_8_ - 1.9342813113834067e+25;
    __tmp = dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
  }
  else {
    __tmp = calculate_sum_weights<double>
                      (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                       &workspace->weights_arr,&workspace->weights_map);
    dStack_70 = extraout_XMM0_Qb;
  }
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this = &imputer->num_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this_00 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,input_data->ncols_categ);
  this_01 = &imputer->cat_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this_01,input_data->ncols_categ,(value_type_conflict *)&ix);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&imputer->num_sum);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_shrink_to_fit(this_00);
  __range3_1 = this_01;
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this_01);
  lVar24 = 0;
  for (uVar26 = 0; uVar18 = input_data->ncols_categ, uVar26 < uVar18; uVar26 = uVar26 + 1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar24),(long)input_data->ncat[uVar26]);
    std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar24));
    lVar24 = lVar24 + 0x18;
  }
  uVar26 = input_data->ncols_numeric;
  if ((uVar18 != 0) || (input_data->Xc_indptr == (int *)0x0 && uVar26 != 0)) {
    pdVar17 = input_data->numeric_data;
    if (bVar10 && bVar11) {
      if (pdVar17 != (double *)0x0) {
        sVar25 = workspace->st;
        uVar22 = workspace->end;
        pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar23 = 0; uVar23 != uVar26; uVar23 = uVar23 + 1) {
          puVar4 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar21 = input_data->nrows;
          pdVar5 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = 0;
          for (sVar27 = sVar25; sVar27 <= uVar22; sVar27 = sVar27 + 1) {
            if ((ulong)ABS(pdVar17[sVar21 * uVar23 + puVar4[sVar27]]) < 0x7ff0000000000000) {
              lVar24 = lVar24 + 1;
              dVar28 = pdVar5[uVar23];
              auVar37._8_4_ = (int)((ulong)lVar24 >> 0x20);
              auVar37._0_8_ = lVar24;
              auVar37._12_4_ = 0x45300000;
              pdVar5[uVar23] =
                   (pdVar17[sVar21 * uVar23 + puVar4[sVar27]] - dVar28) /
                   ((auVar37._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0)) + dVar28;
            }
          }
          auVar32._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar32._0_8_ = lVar24;
          auVar32._12_4_ = 0x45300000;
          pdVar13[uVar23] =
               (auVar32._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
      }
      piVar14 = input_data->categ_data;
      if (piVar14 != (int *)0x0) {
        sVar25 = workspace->st;
        uVar26 = workspace->end;
        pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar22 = 0; uVar22 != uVar18; uVar22 = uVar22 + 1) {
          puVar4 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar21 = input_data->nrows;
          pvVar20 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar24 = 0;
          for (sVar27 = sVar25; sVar27 <= uVar26; sVar27 = sVar27 + 1) {
            lVar19 = (long)piVar14[sVar21 * uVar22 + puVar4[sVar27]];
            if (-1 < lVar19) {
              lVar24 = lVar24 + 1;
              lVar9 = *(long *)&pvVar20[uVar22].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data;
              *(double *)(lVar9 + lVar19 * 8) = *(double *)(lVar9 + lVar19 * 8) + 1.0;
            }
          }
          auVar35._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar35._0_8_ = lVar24;
          auVar35._12_4_ = 0x45300000;
          pdVar13[uVar22] =
               (auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
      }
    }
    else {
      if (pdVar17 != (double *)0x0) {
        for (uVar18 = 0; uVar18 < uVar26; uVar18 = uVar18 + 1) {
          sVar25 = workspace->st;
          lVar24 = sVar25 * 8;
          dVar28 = 0.0;
          dVar33 = 0.0;
          for (; sVar25 <= workspace->end; sVar25 = sVar25 + 1) {
            puVar4 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar19 = *(long *)((long)puVar4 + lVar24);
            dVar38 = input_data->numeric_data[lVar19 + input_data->nrows * uVar18];
            if ((ulong)ABS(dVar38) < 0x7ff0000000000000) {
              pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pdVar13) {
                local_60 = dVar28;
                pVar39 = tsl::detail_robin_hash::
                         robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         ::try_emplace<unsigned_long_const&>
                                   ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                     *)&workspace->weights_map,
                                    (unsigned_long *)((long)puVar4 + lVar24));
                puVar15 = (pVar39.first.m_bucket.m_bucket)->m_value + 8;
                dVar28 = local_60;
              }
              else {
                puVar15 = (uchar *)(pdVar13 + lVar19);
              }
              dVar1 = *(double *)puVar15;
              pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13[uVar18] = dVar1 + pdVar13[uVar18];
              dVar28 = dVar38 * dVar1 - dVar28;
              dVar38 = dVar33 + dVar28;
              dVar28 = (dVar38 - dVar33) - dVar28;
              dVar33 = dVar38;
            }
            lVar24 = lVar24 + 8;
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               dVar33 / (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18];
          uVar26 = input_data->ncols_numeric;
        }
        uVar18 = input_data->ncols_categ;
      }
      if (uVar18 != 0) {
        for (uVar26 = workspace->st; uVar26 <= workspace->end; uVar26 = uVar26 + 1) {
          ix = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar26];
          pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar13) {
            pVar39 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&ix);
            puVar15 = (pVar39.first.m_bucket.m_bucket)->m_value + 8;
            uVar18 = input_data->ncols_categ;
          }
          else {
            puVar15 = (uchar *)(pdVar13 + ix);
          }
          dVar28 = *(double *)puVar15;
          sVar25 = input_data->nrows;
          piVar14 = input_data->categ_data + ix;
          pvVar20 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
            lVar24 = (long)*piVar14;
            if (-1 < lVar24) {
              lVar19 = *(long *)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data;
              *(double *)(lVar19 + lVar24 * 8) = *(double *)(lVar19 + lVar24 * 8) + dVar28;
              pdVar13[uVar22] = pdVar13[uVar22] + dVar28;
            }
            pvVar20 = pvVar20 + 1;
            piVar14 = piVar14 + sVar25;
          }
        }
      }
    }
  }
  if (input_data->Xc_indptr == (int *)0x0) {
LAB_00162124:
    auVar30._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
    auVar30._8_4_ = (int)(min_imp_obs >> 0x20);
    auVar30._12_4_ = 0x45300000;
    dVar28 = (auVar30._8_8_ - 1.9342813113834067e+25) + (auVar30._0_8_ - 4503599627370496.0);
    pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar13) {
      sVar25 = input_data->ncols_numeric;
      pdVar5 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar6 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar21 = 0; sVar21 != sVar25; sVar21 = sVar21 + 1) {
        pdVar17 = pdVar5 + sVar21;
        lVar24 = 2;
        pIVar16 = imputer;
        if (*pdVar17 <= dVar28 && dVar28 != *pdVar17) {
          while( true ) {
            sVar27 = pIVar16->parent;
            pIVar16 = pIVar6 + sVar27;
            dVar33 = *(double *)
                      (*(long *)&pIVar6[sVar27].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar21 * 8);
            if ((ulong)ABS(dVar33) < 0x7ff0000000000000) break;
            if (sVar27 == 0) {
              pdVar13[sVar21] = NAN;
              dVar33 = 0.0;
              goto LAB_0016221f;
            }
            lVar24 = lVar24 + 2;
          }
          pdVar13[sVar21] =
               dVar33 / (pIVar16->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar21];
          auVar34._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar34._0_8_ = lVar24;
          auVar34._12_4_ = 0x45300000;
          dVar33 = __tmp / ((auVar34._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
LAB_0016221f:
          pdVar5[sVar21] = dVar33;
        }
      }
    }
    pvVar20 = (imputer->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((imputer->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar20) {
      piVar14 = input_data->ncat;
      sVar25 = input_data->ncols_categ;
      pdVar5 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar6 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar21 = 0; sVar21 != sVar25; sVar21 = sVar21 + 1) {
        pIVar16 = imputer;
        lVar24 = 2;
        if (dVar28 <= pdVar5[sVar21]) {
          pdVar7 = pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar17 = pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start; pdVar17 != pdVar7; pdVar17 = pdVar17 + 1
              ) {
            *pdVar17 = *pdVar17 / pdVar5[sVar21];
          }
        }
        else {
          while( true ) {
            sVar27 = pIVar16->parent;
            pIVar16 = pIVar6 + sVar27;
            lVar19 = *(long *)&pIVar6[sVar27].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            if (0.0 < *(double *)(lVar19 + sVar21 * 8)) break;
            if (sVar27 == 0) goto LAB_00162366;
            lVar24 = lVar24 + 2;
          }
          auVar36._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar36._0_8_ = lVar24;
          auVar36._12_4_ = 0x45300000;
          uVar12 = piVar14[sVar21];
          if (piVar14[sVar21] < 1) {
            uVar12 = 0;
          }
          for (uVar26 = 0; uVar12 != uVar26; uVar26 = uVar26 + 1) {
            dVar33 = *(double *)
                      (*(long *)&(pIVar16->cat_sum).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar21].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar26 * 8);
            dVar38 = 0.0;
            if (0.0 < dVar33) {
              dVar38 = dVar33 / *(double *)(lVar19 + sVar21 * 8);
            }
            pdVar8 = pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8[uVar26] = dVar38 + pdVar8[uVar26];
            pdVar5[sVar21] =
                 __tmp / ((auVar36._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
          }
LAB_00162366:
          dVar33 = 0.0;
          for (pdVar17 = pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
              pdVar17 !=
              pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
            dVar33 = dVar33 + *pdVar17;
          }
          pdVar5[sVar21] = dVar33;
        }
      }
    }
    WVar3 = local_48->weigh_imp_rows;
    if (WVar3 == Flat) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / __tmp;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / __tmp;
      }
    }
    else if (WVar3 == Inverse) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / (SQRT(__tmp) * __tmp);
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / (SQRT(__tmp) * __tmp);
      }
    }
    lVar24 = local_58 + 1;
    auVar31._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar31._0_8_ = lVar24;
    auVar31._12_4_ = 0x45300000;
    dVar28 = (auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
    if (local_48->depth_imp == Higher) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 * dVar28;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 * dVar28;
      }
    }
    else if (local_48->depth_imp == Lower) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / dVar28;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar7;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / dVar28;
      }
    }
    if ((WVar3 != Prop) || (local_48->depth_imp != Same)) {
      sVar25 = input_data->ncols_numeric;
      pdVar5 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar21 = 0; sVar25 != sVar21; sVar21 = sVar21 + 1) {
        pdVar13[sVar21] = pdVar5[sVar21] * pdVar13[sVar21];
      }
      piVar14 = input_data->ncat;
      sVar25 = input_data->ncols_categ;
      for (sVar21 = 0; sVar21 != sVar25; sVar21 = sVar21 + 1) {
        pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = piVar14[sVar21];
        if (piVar14[sVar21] < 1) {
          uVar12 = 0;
        }
        for (uVar26 = 0; uVar12 != uVar26; uVar26 = uVar26 + 1) {
          pdVar5 = pvVar20[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar26] = pdVar13[sVar21] * pdVar5[uVar26];
        }
      }
    }
    return;
  }
  puVar4 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar13 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar13 != pdVar5; pdVar13 = pdVar13 + 1) {
    *pdVar13 = __tmp;
  }
  local_40 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              *)&workspace->weights_map;
  dVar28 = (double)0;
  local_68 = puVar4;
LAB_00161f2b:
  if ((ulong)dVar28 < input_data->ncols_numeric) {
    lVar19 = (long)input_data->Xc_indptr[(long)dVar28];
    local_60 = (double)((long)dVar28 + 1);
    lVar24 = (long)input_data->Xc_indptr[(long)dVar28 + 1];
    iVar2 = input_data->Xc_ind[lVar24 + -1];
    key = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                    (local_68 + workspace->st,puVar4 + workspace->end + 1,
                     input_data->Xc_ind + lVar19);
LAB_00161f86:
    do {
      if (((key == puVar4 + workspace->end + 1) || (lVar19 == lVar24)) ||
         (uVar26 = *key, (ulong)(long)iVar2 < uVar26)) goto LAB_001620f5;
      piVar14 = input_data->Xc_ind;
      if (piVar14[lVar19] == (int)uVar26) {
        dVar33 = input_data->Xc[lVar19];
        pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == pdVar13) {
          dVar38 = 1.0;
          if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
            local_38 = dVar33;
            pVar39 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>(local_40,key);
            puVar15 = (pVar39.first.m_bucket.m_bucket)->m_value + 8;
            dVar33 = local_38;
            goto LAB_00162060;
          }
        }
        else {
          puVar15 = (uchar *)(pdVar13 + uVar26);
LAB_00162060:
          dVar38 = *(double *)puVar15;
        }
        if ((ulong)ABS(dVar33) < 0x7ff0000000000000) {
          pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13[(long)dVar28] = dVar38 * dVar33 + pdVar13[(long)dVar28];
        }
        else {
          pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13[(long)dVar28] = pdVar13[(long)dVar28] - dVar38;
        }
        if ((key == local_68 + workspace->end) || (lVar19 == lVar24 + -1)) goto LAB_001620f5;
        key = key + 1;
        piVar14 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (input_data->Xc_ind + lVar19,input_data->Xc_ind + lVar24,key);
      }
      else {
        if ((int)uVar26 < piVar14[lVar19]) {
          key = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>();
          goto LAB_00161f86;
        }
        piVar14 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (piVar14 + lVar19 + 1,piVar14 + lVar24,key);
      }
      lVar19 = (long)piVar14 - (long)input_data->Xc_ind >> 2;
    } while( true );
  }
  goto LAB_00162124;
LAB_001620f5:
  pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13[(long)dVar28] =
       pdVar13[(long)dVar28] /
       (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[(long)dVar28];
  dVar28 = local_60;
  goto LAB_00161f2b;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}